

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_solve_symbolic.c
# Opt level: O0

lu_int lu_solve_symbolic(lu_int m,lu_int *begin,lu_int *end,lu_int *index,lu_int nrhs,lu_int *irhs,
                        lu_int *ilhs,lu_int *pstack,lu_int *marked,lu_int M)

{
  int iVar1;
  lu_int *in_RCX;
  lu_int *in_RDX;
  undefined8 in_RSI;
  lu_int in_EDI;
  int in_R8D;
  long in_R9;
  lu_int *unaff_retaddr;
  lu_int *in_stack_00000008;
  lu_int in_stack_00000010;
  long in_stack_00000018;
  lu_int top;
  lu_int n;
  lu_int i;
  undefined4 local_3c;
  int iVar2;
  undefined4 in_stack_ffffffffffffffd8;
  
  local_3c = in_EDI;
  for (iVar2 = 0; iVar2 < in_R8D; iVar2 = iVar2 + 1) {
    iVar1 = *(int *)(in_R9 + (long)iVar2 * 4);
    if (*(int *)(in_stack_00000018 + (long)iVar1 * 4) != n) {
      local_3c = lu_dfs((lu_int)in_RSI,in_RDX,in_RCX,
                        (lu_int *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                        (lu_int)((ulong)in_R9 >> 0x20),(lu_int *)CONCAT44(iVar1,iVar2),unaff_retaddr
                        ,in_stack_00000008,in_stack_00000010);
    }
  }
  return local_3c;
}

Assistant:

lu_int lu_solve_symbolic
(
    const lu_int m,
    const lu_int *begin,
    const lu_int *end,
    const lu_int *index,
    const lu_int nrhs,
    const lu_int *irhs,
    lu_int *ilhs,
    lu_int *pstack,             /* size m workspace */
    lu_int *marked,             /* marked[i] != M on entry */
    const lu_int M
)
{
    lu_int i, n, top = m;

    for (n = 0; n < nrhs; n++)
        if (marked[i = irhs[n]] != M)
            top = lu_dfs(i, begin, end, index, top, ilhs, pstack, marked, M);

    return top;
}